

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O0

void __thiscall
HighsDomain::CutpoolPropagation::cutAdded(CutpoolPropagation *this,HighsInt cut,bool propagate)

{
  undefined1 *puVar1;
  HighsInt HVar2;
  HighsInt HVar3;
  pointer pHVar4;
  HighsDomain *this_00;
  double *pdVar5;
  size_type sVar6;
  byte *pbVar7;
  CutpoolPropagation *this_01;
  undefined1 in_DL;
  int in_ESI;
  long in_RDI;
  double *arvalue_1;
  HighsInt *arindex_1;
  HighsInt end_1;
  HighsInt start_1;
  double *arvalue;
  HighsInt *arindex;
  HighsInt end;
  HighsInt start;
  undefined8 in_stack_ffffffffffffff48;
  HighsDynamicRowMatrix *in_stack_ffffffffffffff50;
  size_type in_stack_ffffffffffffff68;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> *in_stack_ffffffffffffff70;
  size_type in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  HighsInt *in_stack_ffffffffffffffc0;
  CutpoolPropagation *ninfmin;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  HighsInt HVar8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined8 in_stack_ffffffffffffffd8;
  HighsDomain *in_stack_ffffffffffffffe0;
  undefined3 in_stack_fffffffffffffff0;
  uint uVar9;
  
  HVar3 = (HighsInt)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  uVar9 = CONCAT13(in_DL,in_stack_fffffffffffffff0) & 0x1ffffff;
  if ((char)(uVar9 >> 0x18) == '\0') {
    puVar1 = *(undefined1 **)(in_RDI + 8);
    pHVar4 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x5bd691);
    if ((HighsDomain *)puVar1 == &pHVar4->domain) {
      HighsCutPool::getMatrix(*(HighsCutPool **)(in_RDI + 0x10));
      HighsDynamicRowMatrix::getRowStart(in_stack_ffffffffffffff50,HVar3);
      HighsCutPool::getMatrix(*(HighsCutPool **)(in_RDI + 0x10));
      HighsDynamicRowMatrix::getRowEnd(in_stack_ffffffffffffff50,HVar3);
      HighsCutPool::getMatrix(*(HighsCutPool **)(in_RDI + 0x10));
      this_00 = (HighsDomain *)HighsDynamicRowMatrix::getARindex((HighsDynamicRowMatrix *)0x5bd70c);
      HighsCutPool::getMatrix(*(HighsCutPool **)(in_RDI + 0x10));
      pdVar5 = HighsDynamicRowMatrix::getARvalue((HighsDynamicRowMatrix *)0x5bd72d);
      sVar6 = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::size
                        ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)(in_RDI + 0x18));
      if ((int)sVar6 <= in_ESI) {
        std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::resize
                  (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff70,
                   in_stack_ffffffffffffff68);
        in_stack_ffffffffffffffd4 = CONCAT13(2,(int3)in_stack_ffffffffffffffd4);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   in_stack_ffffffffffffff78,(value_type_conflict5 *)in_stack_ffffffffffffff70);
        std::vector<double,_std::allocator<double>_>::resize
                  ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff70,
                   in_stack_ffffffffffffff68);
      }
      pbVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x48),
                          (long)in_ESI);
      *pbVar7 = *pbVar7 & 0xfd;
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x30),(long)in_ESI);
      std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)(in_RDI + 0x18),(long)in_ESI
                );
      computeMinActivity(this_00,(HighsInt)((ulong)pdVar5 >> 0x20),(HighsInt)pdVar5,
                         (HighsInt *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                         (double *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                         in_stack_ffffffffffffffc0,(HighsCDouble *)CONCAT44(in_ESI,uVar9));
    }
  }
  else {
    HighsCutPool::getMatrix(*(HighsCutPool **)(in_RDI + 0x10));
    HVar2 = HighsDynamicRowMatrix::getRowStart(in_stack_ffffffffffffff50,HVar3);
    HighsCutPool::getMatrix(*(HighsCutPool **)(in_RDI + 0x10));
    HVar3 = HighsDynamicRowMatrix::getRowEnd(in_stack_ffffffffffffff50,HVar3);
    HighsCutPool::getMatrix(*(HighsCutPool **)(in_RDI + 0x10));
    this_01 = (CutpoolPropagation *)
              HighsDynamicRowMatrix::getARindex((HighsDynamicRowMatrix *)0x5bd8dc);
    HighsCutPool::getMatrix(*(HighsCutPool **)(in_RDI + 0x10));
    HighsDynamicRowMatrix::getARvalue((HighsDynamicRowMatrix *)0x5bd8fa);
    sVar6 = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::size
                      ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)(in_RDI + 0x18));
    if ((int)sVar6 <= in_ESI) {
      std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::resize
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff70,
                 in_stack_ffffffffffffff68);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff78,(value_type_conflict5 *)in_stack_ffffffffffffff70);
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff70,
                 in_stack_ffffffffffffff68);
    }
    pbVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x48),
                        (long)in_ESI);
    *pbVar7 = *pbVar7 & 0xfd;
    ninfmin = this_01;
    HVar8 = HVar3;
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x30),(long)in_ESI);
    std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
              ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)(in_RDI + 0x18),(long)in_ESI);
    computeMinActivity(in_stack_ffffffffffffffe0,
                       (HighsInt)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                       (HighsInt)in_stack_ffffffffffffffd8,
                       (HighsInt *)CONCAT44(in_stack_ffffffffffffffd4,HVar2),
                       (double *)CONCAT44(HVar8,in_stack_ffffffffffffffc8),&ninfmin->cutpoolindex,
                       (HighsCDouble *)CONCAT44(in_ESI,uVar9));
    recomputeCapacityThreshold
              ((CutpoolPropagation *)in_stack_ffffffffffffffe0,
               (HighsInt)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
    markPropagateCut(this_01,HVar3);
  }
  return;
}

Assistant:

void HighsDomain::CutpoolPropagation::cutAdded(HighsInt cut, bool propagate) {
  if (!propagate) {
    if (domain != &domain->mipsolver->mipdata_->domain) return;
    HighsInt start = cutpool->getMatrix().getRowStart(cut);
    HighsInt end = cutpool->getMatrix().getRowEnd(cut);
    const HighsInt* arindex = cutpool->getMatrix().getARindex();
    const double* arvalue = cutpool->getMatrix().getARvalue();

    if (HighsInt(activitycuts_.size()) <= cut) {
      activitycuts_.resize(cut + 1);
      activitycutsinf_.resize(cut + 1);
      propagatecutflags_.resize(cut + 1, 2);
      capacityThreshold_.resize(cut + 1);
    }

    propagatecutflags_[cut] &= ~uint8_t{2};
    domain->computeMinActivity(start, end, arindex, arvalue,
                               activitycutsinf_[cut], activitycuts_[cut]);
  } else {
    HighsInt start = cutpool->getMatrix().getRowStart(cut);
    HighsInt end = cutpool->getMatrix().getRowEnd(cut);
    const HighsInt* arindex = cutpool->getMatrix().getARindex();
    const double* arvalue = cutpool->getMatrix().getARvalue();

    if (HighsInt(activitycuts_.size()) <= cut) {
      activitycuts_.resize(cut + 1);
      activitycutsinf_.resize(cut + 1);
      propagatecutflags_.resize(cut + 1, 2);
      capacityThreshold_.resize(cut + 1);
    }

    propagatecutflags_[cut] &= ~uint8_t{2};
    domain->computeMinActivity(start, end, arindex, arvalue,
                               activitycutsinf_[cut], activitycuts_[cut]);

    recomputeCapacityThreshold(cut);
    markPropagateCut(cut);
  }
}